

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZone::CVmTimeZone(CVmTimeZone *this,os_tzinfo_t *desc)

{
  char *pcVar1;
  EVP_PKEY_CTX *in_RSI;
  CVmTimeZone *in_RDI;
  char buf2 [128];
  char buf1 [128];
  char buf [128];
  undefined1 local_198 [8];
  char *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe98;
  int32_t in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  undefined1 local_118 [72];
  char local_98 [136];
  EVP_PKEY_CTX *local_10;
  
  in_RDI->hashentry_ = (ZoneHashEntry *)0x0;
  local_10 = in_RSI;
  if (((in_RSI[8] == (EVP_PKEY_CTX)0x0) || (in_RSI[0x18] == (EVP_PKEY_CTX)0x0)) ||
     (*(int *)in_RSI == *(int *)(in_RSI + 4))) {
    if (*(int *)(in_RSI + 0x58) == 0) {
      gen_ofs_string(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    }
    else {
      gen_ofs_string(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    }
  }
  else {
    gen_ofs_string(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    if (*(int *)(local_10 + 4) == *(int *)local_10 + 0xe10) {
      lib_strcpy(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
    else {
      gen_ofs_string(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    }
    t3sprintf(local_98,0x80,"%s%s",local_118,local_198);
  }
  pcVar1 = lib_copy_str((char *)in_RDI);
  in_RDI->name_ = pcVar1;
  init(in_RDI,local_10);
  return;
}

Assistant:

CVmTimeZone::CVmTimeZone(const os_tzinfo_t *desc)
{
    /* no hash entry */
    hashentry_ = 0;

    /* 
     *   Synthesize a POSIX-style name from the abbreviation and offset.  If
     *   we have both standard and daylight abbreviations and distinct
     *   offsets, generate a POSIX-style "EST5DST" string.  Otherwise just
     *   use the active abbreviation and offset.
     *   
     *   Note that the offset in POSIX strings uses the opposite sign from
     *   what we use - EST is +5 in POSIX strings vs -5 in the zoneinfo
     *   scheme (which is what we use).
     */
    char buf[128];
    if (desc->std_abbr[0] != 0 && desc->dst_abbr[0] != 0
        && desc->std_ofs != desc->dst_ofs)
    {
        /* 
         *   Use both abbreviations, as in EST5DST.  If the daylight offset
         *   is one hour higher than the standard offset, omit the offset
         *   from the daylight part, since that's the default; otherwise
         *   include it.
         */
        char buf1[128], buf2[128];
        gen_ofs_string(buf1, sizeof(buf1), desc->std_abbr, -desc->std_ofs, 0);
        if (desc->dst_ofs == desc->std_ofs + 3600)
            lib_strcpy(buf2, sizeof(buf2), desc->dst_abbr);
        else
            gen_ofs_string(buf2, sizeof(buf2),
                           desc->dst_abbr, -desc->dst_ofs, 0);

        /* build the combined string */
        t3sprintf(buf, sizeof(buf), "%s%s", buf1, buf2);
    }
    else if (desc->is_dst)
    {
        /* use the daylight abbreviation only */
        gen_ofs_string(buf, sizeof(buf), desc->dst_abbr, -desc->dst_ofs, 0);
    }
    else
    {
        /* use the standard time abbreviation only */
        gen_ofs_string(buf, sizeof(buf), desc->std_abbr, -desc->std_ofs, 0);
    }

    /* save the name */
    name_ = lib_copy_str(buf);

    /* initialize from the descriptor */
    init(desc);
}